

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericitemmodel.cpp
# Opt level: O0

QVariant * __thiscall
QGenericItemModel::headerData(QGenericItemModel *this,int section,Orientation orientation,int role)

{
  long lVar1;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  int *unaff_retaddr;
  Orientation *in_stack_00000008;
  ConstOp in_stack_0000001c;
  undefined4 in_stack_00000020;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter>::operator->
            ((unique_ptr<QGenericItemModelImplBase,_QGenericItemModel::Deleter> *)0x84f887);
  QGenericItemModelImplBase::callConst<QVariant,int,Qt::Orientation,int>
            ((QGenericItemModelImplBase *)CONCAT44(role,in_stack_00000020),in_stack_0000001c,
             (int *)this,in_stack_00000008,unaff_retaddr);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGenericItemModel::headerData(int section, Qt::Orientation orientation, int role) const
{
    return impl->callConst<QVariant>(QGenericItemModelImplBase::HeaderData,
                                     section, orientation, role);
}